

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O0

void nrg::InstantExecution::
     push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>
               (Queue *queue,
               _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_4)

{
  function<void_()> local_a8;
  undefined1 local_78 [48];
  undefined1 local_48 [8];
  QueueElement elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_local_1;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_local;
  _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *fn_local;
  Queue *queue_local;
  
  local_78._8_8_ = param->_M_data;
  local_78._0_8_ = fn;
  elem._M_invoker = (_Invoker_type)param_4;
  std::__cxx11::string::string((string *)(local_78 + 0x10),(string *)param_4);
  std::function<void()>::
  function<nrg::InstantExecution::push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>&&,std::__cxx11::string&&)::_lambda()_1_,void>
            ((function<void()> *)local_48,(anon_class_48_3_7e084ec6 *)local_78);
  push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>&&,std::__cxx11::string&&)
  ::{lambda()#1}::~queue((_lambda___1_ *)local_78);
  std::function<void_()>::function(&local_a8,(function<void_()> *)local_48);
  push(queue,&local_a8);
  std::function<void_()>::~function(&local_a8);
  std::function<void_()>::~function((function<void_()> *)local_48);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }